

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

int __thiscall
Player::executeFortify(Player *this,Country *fromCountry,Country *countryToFortify,int numArmies)

{
  pointer pcVar1;
  ostream *poVar2;
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  *fromCountry->pNumberOfTroops = *fromCountry->pNumberOfTroops - numArmies;
  *countryToFortify->pNumberOfTroops = *countryToFortify->pNumberOfTroops + numArmies;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nPlayer ",8);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*this->pPlayerId);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," has fortified ",0xf);
  pcVar1 = (countryToFortify->cyName->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + countryToFortify->cyName->_M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," from ",6);
  pcVar1 = (fromCountry->cyName->_M_dataplus)._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + fromCountry->cyName->_M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_68,local_60);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  (*this->strategy->_vptr_PlayerStrategy[5])();
  return 1;
}

Assistant:

int Player::executeFortify(Map::Country &fromCountry, Map::Country &countryToFortify, int numArmies) {
    /*
     * Act of moving armies between this player's owned countries.
     * fromCountry and countryToFortify have to be owned by this player and adjacent to each other.
     */

    fromCountry.setNumberOfTroops(fromCountry.getNumberOfTroops() - numArmies);
    countryToFortify.setNumberOfTroops(countryToFortify.getNumberOfTroops() + numArmies);
    std::cout << "\nPlayer " << this->getPlayerId() << " has fortified " << countryToFortify.getCountryName()
              << " from "
              << fromCountry.getCountryName() << std::endl;
    this->strategy->resetChoices();
    return PlayerAction::SUCCEEDED;
}